

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O1

void __thiscall
COLLADASaxFWL::KinematicsBindJointAxis::KinematicsBindJointAxis
          (KinematicsBindJointAxis *this,SidAddress *target)

{
  pointer pcVar1;
  size_t sVar2;
  
  this->_vptr_KinematicsBindJointAxis = (_func_int **)&PTR__KinematicsBindJointAxis_009337d8;
  (this->mTarget)._vptr_SidAddress = (_func_int **)&PTR__SidAddress_00929550;
  (this->mTarget).mId._M_dataplus._M_p = (pointer)&(this->mTarget).mId.field_2;
  pcVar1 = (target->mId)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->mTarget).mId,pcVar1,pcVar1 + (target->mId)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->mTarget).mSids,&target->mSids);
  (this->mTarget).mMemberSelection = target->mMemberSelection;
  (this->mTarget).mMemberSelectionName._M_dataplus._M_p =
       (pointer)&(this->mTarget).mMemberSelectionName.field_2;
  pcVar1 = (target->mMemberSelectionName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->mTarget).mMemberSelectionName,pcVar1,
             pcVar1 + (target->mMemberSelectionName)._M_string_length);
  (this->mTarget).mIsValid = target->mIsValid;
  sVar2 = target->mSecondIndex;
  (this->mTarget).mFirstIndex = target->mFirstIndex;
  (this->mTarget).mSecondIndex = sVar2;
  (this->mAxis)._vptr_KinematicsSidrefOrParam = (_func_int **)&PTR__KinematicsSidrefOrParam_00928fb8
  ;
  (this->mAxis).mValueType = VALUETYPE_UNKNOWN;
  (this->mAxis).mSymbol._M_dataplus._M_p = (pointer)&(this->mAxis).mSymbol.field_2;
  (this->mAxis).mSymbol._M_string_length = 0;
  (this->mAxis).mSymbol.field_2._M_local_buf[0] = '\0';
  (this->mValue)._vptr_KinematicsFloatOrParam = (_func_int **)&PTR__KinematicsFloatOrParam_00928fd8;
  (this->mValue).mValueType = VALUETYPE_UNKNOWN;
  (this->mValue).mSymbol._M_dataplus._M_p = (pointer)&(this->mValue).mSymbol.field_2;
  (this->mValue).mSymbol._M_string_length = 0;
  (this->mValue).mSymbol.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

KinematicsBindJointAxis(SidAddress target) : mTarget(target){}